

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

ETraceStatus ProcessRailHit(FTraceResults *res,void *userdata)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  DVector2 ofs;
  SRailHit newhit;
  FName local_80;
  FName local_7c;
  FName local_78;
  TFlags<ActorFlag2,_unsigned_int> local_74;
  undefined1 local_70 [8];
  SPortalHit newhit_1;
  RailData *data;
  void *userdata_local;
  FTraceResults *res_local;
  
  newhit_1.OutDir.Z = (double)userdata;
  if (res->HitType == TRACE_CrossingPortal) {
    SPortalHit::SPortalHit((SPortalHit *)local_70);
    TVector3<double>::operator=((TVector3<double> *)local_70,&res->HitPos);
    TVector3<double>::operator=((TVector3<double> *)&newhit_1.HitPos.Z,&res->SrcFromTarget);
    TVector3<double>::operator=((TVector3<double> *)&newhit_1.ContPos.Z,&res->HitVector);
    TArray<SPortalHit,_SPortalHit>::Push
              ((TArray<SPortalHit,_SPortalHit> *)((long)newhit_1.OutDir.Z + 0x18),
               (SPortalHit *)local_70);
    return TRACE_Continue;
  }
  if (res->HitType != TRACE_HitActor) {
    return TRACE_Stop;
  }
  bVar3 = false;
  if ((*(byte *)((long)userdata + 0x2d) & 1) != 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_74,(int)res->Actor + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
    bVar3 = uVar2 != 0;
  }
  if (bVar3) {
    return TRACE_Stop;
  }
  bVar3 = true;
  if ((*(byte *)((long)newhit_1.OutDir.Z + 0x31) & 1) == 0) {
    if ((*(byte *)((long)newhit_1.OutDir.Z + 0x30) & 1) != 0) {
      (*(res->Actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_78);
      (**(code **)(**(long **)newhit_1.OutDir.Z + 0x108))(&local_7c);
      bVar1 = FName::operator==(&local_78,&local_7c);
      bVar3 = true;
      if (bVar1) goto LAB_0067bb26;
    }
    if ((*(byte *)((long)newhit_1.OutDir.Z + 0x2f) & 1) != 0) {
      (*(res->Actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_80);
      bVar1 = FName::operator==(&local_80,(FName *)((long)newhit_1.OutDir.Z + 0x28));
      bVar3 = true;
      if (bVar1) goto LAB_0067bb26;
    }
    bVar3 = false;
    if ((*(byte *)((long)newhit_1.OutDir.Z + 0x2e) & 1) != 0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                ((TFlags<ActorFlag3,_unsigned_int> *)((long)&newhit.HitAngle.Degrees + 4),
                 (int)res->Actor + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG)
                );
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&newhit.HitAngle.Degrees + 4));
      bVar3 = uVar2 != 0;
    }
  }
LAB_0067bb26:
  if (bVar3) {
    res_local._4_4_ = TRACE_Skip;
  }
  else {
    SRailHit::SRailHit((SRailHit *)&ofs.Y);
    ofs.Y = (double)res->Actor;
    TVector3<double>::operator=((TVector3<double> *)&newhit,&res->HitPos);
    TAngle<double>::operator=((TAngle<double> *)&newhit.HitPos.Z,&res->SrcAngleFromTarget);
    if ((i_compatflags & 0x10000000U) != 0) {
      P_GetOffsetPosition((double)newhit.HitActor,newhit.HitPos.X,(res->HitVector).X * -10.0,
                          (res->HitVector).Y * -10.0);
      newhit.HitPos.X = ofs.X;
      newhit.HitPos.Y = newhit.HitPos.Y - (res->HitVector).Z * -10.0;
    }
    TArray<SRailHit,_SRailHit>::Push
              ((TArray<SRailHit,_SRailHit> *)((long)newhit_1.OutDir.Z + 8),(SRailHit *)&ofs.Y);
    if (*(int *)((long)newhit_1.OutDir.Z + 0x34) != 0) {
      *(int *)((long)newhit_1.OutDir.Z + 0x38) = *(int *)((long)newhit_1.OutDir.Z + 0x38) + 1;
    }
    bVar3 = true;
    if (((*(byte *)((long)newhit_1.OutDir.Z + 0x2c) & 1) == 0) &&
       (bVar3 = false, *(int *)((long)newhit_1.OutDir.Z + 0x34) != 0)) {
      bVar3 = *(int *)((long)newhit_1.OutDir.Z + 0x34) <= *(int *)((long)newhit_1.OutDir.Z + 0x38);
    }
    res_local._4_4_ = (ETraceStatus)!bVar3;
  }
  return res_local._4_4_;
}

Assistant:

static ETraceStatus ProcessRailHit(FTraceResults &res, void *userdata)
{
	RailData *data = (RailData *)userdata;
	if (res.HitType == TRACE_CrossingPortal)
	{
		SPortalHit newhit;
		newhit.HitPos = res.HitPos;
		newhit.ContPos = res.SrcFromTarget;
		newhit.OutDir = res.HitVector;
		data->PortalHits.Push(newhit);
		return TRACE_Continue;
	}

	if (res.HitType != TRACE_HitActor)
	{
		return TRACE_Stop;
	}

	// Invulnerable things completely block the shot
	if (data->StopAtInvul && res.Actor->flags2 & MF2_INVULNERABLE)
	{
		return TRACE_Stop;
	}

	// Skip actors if the puff has:
	// 1. THRUACTORS (This one did NOT include a check for spectral)
	// 2. MTHRUSPECIES on puff and the shooter has same species as the hit actor
	// 3. THRUSPECIES on puff and the puff has same species as the hit actor
	// 4. THRUGHOST on puff and the GHOST flag on the hit actor

	if ((data->ThruActors) ||
		(data->MThruSpecies && res.Actor->GetSpecies() == data->Caller->GetSpecies()) ||
		(data->ThruSpecies && res.Actor->GetSpecies() == data->PuffSpecies) ||
		(data->ThruGhosts && res.Actor->flags3 & MF3_GHOST))
	{
		return TRACE_Skip;
	}

	// Save this thing for damaging later, and continue the trace
	SRailHit newhit;
	newhit.HitActor = res.Actor;
	newhit.HitPos = res.HitPos;
	newhit.HitAngle = res.SrcAngleFromTarget;
	if (i_compatflags & COMPATF_HITSCAN)
	{
		DVector2 ofs = P_GetOffsetPosition(newhit.HitPos.X, newhit.HitPos.Y, -10 * res.HitVector.X, -10 * res.HitVector.Y);
		newhit.HitPos.X = ofs.X;
		newhit.HitPos.Y = ofs.Y;
		newhit.HitPos.Z -= -10 * res.HitVector.Z;
	}
	data->RailHits.Push(newhit);

	if (data->limit)
	{
		data->count++;
	}
	return (data->StopAtOne || (data->limit && (data->count >= data->limit))) ? TRACE_Stop : TRACE_Continue;
}